

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

event_item * storage_queue_default_dequeue(CManager_conflict cm,storage_queue_ptr queue)

{
  queue_item *pqVar1;
  _event_path_data *p_Var2;
  event_item *peVar3;
  queue_item *pqVar4;
  
  pqVar1 = (queue->u).queue.queue_head;
  if (pqVar1 != (queue_item *)0x0) {
    p_Var2 = cm->evp;
    peVar3 = pqVar1->item;
    if (pqVar1 == (queue->u).queue.queue_tail) {
      (queue->u).queue.queue_tail = (queue_item *)0x0;
      pqVar4 = (queue_item *)0x0;
    }
    else {
      pqVar4 = pqVar1->next;
    }
    (queue->u).data = pqVar4;
    pqVar1->next = p_Var2->queue_items_free_list;
    p_Var2->queue_items_free_list = pqVar1;
    return peVar3;
  }
  return (event_item *)0x0;
}

Assistant:

static event_item *
raw_dequeue_event(CManager cm, queue_ptr q)
{
    event_path_data evp = cm->evp;
    queue_item *item = q->queue_head;
    event_item *event = NULL;
    if (item == NULL) return event;
    event = item->item;
    if (q->queue_head == q->queue_tail) {
	q->queue_head = NULL;
	q->queue_tail = NULL;
    } else {
	q->queue_head = q->queue_head->next;
    }   
    item->next = evp->queue_items_free_list;
    evp->queue_items_free_list = item;
    return event;
}